

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

void FreeMemoryLiteral(ExpressionEvalContext *ctx,ExprMemoryLiteral *memory)

{
  SmallArray<ExprPointerLiteral_*,_32U>::push_back(&ctx->abandonedMemory,&memory->ptr);
  return;
}

Assistant:

void FreeMemoryLiteral(ExpressionEvalContext &ctx, ExprMemoryLiteral *memory)
{
	ctx.abandonedMemory.push_back(memory->ptr);
}